

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int generate_by_miniscript_thresh
              (miniscript_node_t *node,miniscript_node_t *parent,int32_t derive_child_num,
              uchar *script,size_t script_len,size_t *write_len)

{
  int iVar1;
  long lVar2;
  ulong local_78;
  size_t check_len;
  miniscript_node_t *child;
  size_t count;
  size_t offset;
  size_t output_len;
  size_t *psStack_40;
  int ret;
  size_t *write_len_local;
  size_t script_len_local;
  uchar *script_local;
  miniscript_node_t *pmStack_20;
  int32_t derive_child_num_local;
  miniscript_node_t *parent_local;
  miniscript_node_t *node_local;
  
  count = 0;
  child = (miniscript_node_t *)0x0;
  local_78 = script_len;
  if (0x207 < script_len) {
    local_78 = 0x208;
  }
  if ((node->child == (miniscript_node_t *)0x0) ||
     ((parent != (miniscript_node_t *)0x0 && (parent->info == (miniscript_item_t *)0x0)))) {
    node_local._4_4_ = -2;
  }
  else {
    psStack_40 = write_len;
    write_len_local = (size_t *)script_len;
    script_len_local = (size_t)script;
    script_local._4_4_ = derive_child_num;
    pmStack_20 = parent;
    parent_local = node;
    for (check_len = (size_t)node->child->next; check_len != 0;
        check_len = *(size_t *)(check_len + 8)) {
      offset = 0;
      iVar1 = generate_script_from_miniscript
                        ((miniscript_node_t *)check_len,parent_local,script_local._4_4_,
                         (uchar *)(script_len_local + count),(long)write_len_local + (-1 - count),
                         &offset);
      if (iVar1 != 0) {
        return iVar1;
      }
      child = (miniscript_node_t *)((long)&child->info + 1);
      count = offset + count;
      if (local_78 <= count) {
        return -2;
      }
      if (child != (miniscript_node_t *)0x1) {
        if (local_78 <= count + 1) {
          return -2;
        }
        *(undefined1 *)(script_len_local + count) = 0x93;
        count = count + 1;
      }
      output_len._4_4_ = 0;
    }
    node_local._4_4_ =
         generate_script_from_miniscript
                   (parent_local->child,parent_local,script_local._4_4_,
                    (uchar *)(script_len_local + count),(long)write_len_local + (-1 - count),&offset
                   );
    if (node_local._4_4_ == 0) {
      lVar2 = offset + count;
      if (lVar2 + 1U < local_78) {
        *(undefined1 *)(script_len_local + lVar2) = 0x87;
        *psStack_40 = lVar2 + 1;
        node_local._4_4_ = 0;
      }
      else {
        node_local._4_4_ = -2;
      }
    }
  }
  return node_local._4_4_;
}

Assistant:

static int generate_by_miniscript_thresh(
    struct miniscript_node_t *node,
    struct miniscript_node_t *parent,
    int32_t derive_child_num,
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    /* [X1] [X2] ADD ... [Xn] ADD <k> EQUAL */
    int ret;
    size_t output_len;
    size_t offset = 0;
    size_t count = 0;
    struct miniscript_node_t *child = node->child;
    size_t check_len = (DESCRIPTOR_REDEEM_SCRIPT_MAX_SIZE > script_len) ? script_len : DESCRIPTOR_REDEEM_SCRIPT_MAX_SIZE;

    if (!child || (parent && !parent->info))
        return WALLY_EINVAL;

    child = child->next;
    while (child != NULL) {
        output_len = 0;
        ret = generate_script_from_miniscript(child,
                                              node,
                                              derive_child_num,
                                              &script[offset],
                                              script_len - offset - 1,
                                              &output_len);
        if (ret != WALLY_OK)
            return ret;

        ++count;
        offset += output_len;
        if (offset >= check_len)
            return WALLY_EINVAL;

        if (count != 1) {
            if (offset + 1 >= check_len)
                return WALLY_EINVAL;

            script[offset] = OP_ADD;
            ++offset;
        }

        child = child->next;
    }

    ret = generate_script_from_miniscript(node->child,
                                          node,
                                          derive_child_num,
                                          &script[offset],
                                          script_len - offset - 1,
                                          &output_len);
    if (ret != WALLY_OK)
        return ret;

    offset += output_len;
    if (offset + 1 >= check_len)
        return WALLY_EINVAL;

    script[offset] = OP_EQUAL;
    *write_len = offset + 1;
    return WALLY_OK;
}